

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O2

RealType __thiscall OpenMD::NgammaT::calcConservedQuantity(NgammaT *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  SimInfo *this_01;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  RealType RVar9;
  double dVar10;
  RealType RVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<double,_double> pVar14;
  Mat3x3d hmat;
  SquareMatrix<double,_3> tmp;
  RectMatrix<double,_3U,_3U> local_100;
  SquareMatrix3<double> local_b8;
  RectMatrix<double,_3U,_3U> local_70;
  
  pVar14 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat = pVar14;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar8 = SimInfo::getNdf(this_01);
  (this->super_NPT).fkBT = (double)iVar8 * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar9 = Thermo::getTotalEnergy(this_00);
  dVar5 = (this->super_NPT).fkBT;
  dVar6 = (this->super_NPT).tt2;
  dVar1 = (this->super_NPT).thermostat.first;
  dVar7 = (this->super_NPT).thermostat.second;
  SquareMatrix3<double>::transpose(&local_b8,&this->eta);
  operator*((SquareMatrix3<double> *)&local_100,&local_b8,&this->eta);
  RectMatrix<double,_3U,_3U>::operator=(&local_70,&local_100);
  dVar10 = SquareMatrix<double,_3>::trace((SquareMatrix<double,_3> *)&local_70);
  dVar2 = (this->super_NPT).NkBT;
  dVar3 = (this->super_NPT).targetPressure;
  dVar4 = (this->super_NPT).tb2;
  RVar11 = Thermo::getVolume(this_00);
  Snapshot::getHmat((Mat3x3d *)&local_100,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  auVar12._0_8_ = dVar5 * dVar7;
  auVar12._8_8_ = dVar10 * dVar2 * dVar4;
  auVar12 = divpd(auVar12,_DAT_002450e0);
  auVar13._8_8_ =
       *(double *)((long)local_100.data_ + (ulong)this->axis1_ * 0x20) *
       *(double *)((long)local_100.data_ + (ulong)this->axis2_ * 0x20) * this->surfaceTension_;
  auVar13._0_8_ = (RVar11 * dVar3) / 163882576.0;
  auVar13 = divpd(auVar13,_DAT_002450f0);
  return (auVar12._8_8_ + (dVar6 * dVar5 * dVar1 * dVar1) / 0.0008368 + RVar9 + auVar12._0_8_ +
         auVar13._0_8_) - auVar13._8_8_;
}

Assistant:

RealType NgammaT::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType totalEnergy = thermo.getTotalEnergy();

    RealType thermostat_kinetic = fkBT * tt2 * thermostat.first *
                                  thermostat.first /
                                  (2.0 * Constants::energyConvert);

    RealType thermostat_potential =
        fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    RealType trEta                = tmp.trace();

    RealType barostat_kinetic =
        NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    RealType barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    Mat3x3d hmat  = snap->getHmat();
    RealType area = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);

    RealType conservedQuantity =
        totalEnergy + thermostat_kinetic + thermostat_potential +
        barostat_kinetic + barostat_potential -
        surfaceTension_ * area / Constants::energyConvert;

    return conservedQuantity;
  }